

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int process_opts(int argc,char **argv,nt_opts *opts)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  bool bVar4;
  uint local_38;
  int index_4;
  int index_3;
  int count;
  int index_2;
  int index_1;
  int index;
  int ac;
  nt_opts *opts_local;
  char **argv_local;
  int argc_local;
  
  memset(opts,0,0x900);
  opts->prefix = (char *)0x0;
  opts->debug = 1;
  opts->new_datatype = 4;
  opts->new_dim[0] = 3;
  opts->new_dim[1] = 1;
  opts->new_dim[2] = 1;
  opts->new_dim[3] = 1;
  if (argc < 2) {
    iVar1 = usage(*argv,2);
    return iVar1;
  }
  index_1 = 1;
  while( true ) {
    if (argc <= index_1) {
      if (opts->make_im != 0) {
        if (0 < (opts->infiles).len) {
          fprintf(_stderr,"** -infiles is invalid when using -make_im\n");
          return -1;
        }
        opts->cbl = 1;
        iVar1 = add_string(&opts->infiles,"MAKE_IM");
        if (iVar1 != 0) {
          return -1;
        }
      }
      if ((opts->add_exts == 0) || ((opts->elist).len == (opts->etypes).len)) {
        g_debug = opts->debug;
        nifti_set_debug_level(g_debug);
        fill_cmd_string(opts,argc,argv);
        if (2 < g_debug) {
          disp_nt_opts("options read: ",opts);
        }
        argv_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"** ext list length (%d) != etype length (%d)\n",
                (ulong)(uint)(opts->elist).len,(ulong)(uint)(opts->etypes).len);
        argv_local._4_4_ = -1;
      }
      return argv_local._4_4_;
    }
    iVar1 = strncmp(argv[index_1],"-help_datatypes",9);
    if (iVar1 == 0) {
      iVar1 = index_1 + 1;
      if (iVar1 < argc) {
        if ((*argv[iVar1] == 'd') || (*argv[iVar1] == 'D')) {
          nifti_disp_type_list(1);
        }
        else if ((*argv[iVar1] == 't') || (*argv[iVar1] == 'T')) {
          nifti_test_datatype_sizes(1);
        }
        else {
          nifti_disp_type_list(2);
        }
      }
      else {
        nifti_disp_type_list(3);
      }
      return 1;
    }
    iVar1 = strncmp(argv[index_1],"-help_hdr",9);
    if (iVar1 == 0) {
      iVar1 = usage(*argv,4);
      return iVar1;
    }
    iVar1 = strncmp(argv[index_1],"-help_nim",9);
    if (iVar1 == 0) {
      iVar1 = usage(*argv,5);
      return iVar1;
    }
    iVar1 = strncmp(argv[index_1],"-help_ana",9);
    if (iVar1 == 0) break;
    iVar1 = strncmp(argv[index_1],"-help",5);
    if (iVar1 == 0) {
      iVar1 = usage(*argv,2);
      return iVar1;
    }
    iVar1 = strncmp(argv[index_1],"-hist",5);
    if (iVar1 == 0) {
      iVar1 = usage(*argv,3);
      return iVar1;
    }
    iVar1 = strncmp(argv[index_1],"-ver",2);
    if (iVar1 == 0) {
      iVar1 = usage(*argv,8);
      return iVar1;
    }
    iVar1 = strncmp(argv[index_1],"-nifti_hist",0xb);
    if (iVar1 == 0) {
      nifti_disp_lib_hist();
      return 1;
    }
    iVar1 = strncmp(argv[index_1],"-nifti_ver",10);
    if (iVar1 == 0) {
      nifti_disp_lib_version();
      return 1;
    }
    iVar1 = strncmp(argv[index_1],"-with_zlib",5);
    if (iVar1 == 0) {
      iVar1 = nifti_compiled_with_zlib();
      pcVar3 = "NO";
      if (iVar1 != 0) {
        pcVar3 = "YES";
      }
      printf("Was NIfTI library compiled with zlib?  %s\n",pcVar3);
      return 1;
    }
    iVar1 = strncmp(argv[index_1],"-add_afni_ext",9);
    if (iVar1 == 0) {
      index_1 = index_1 + 1;
      if (argc <= index_1) {
        fprintf(_stderr,"** option \'%s\': missing parameter\n","-add_afni_ext");
        fprintf(_stderr,"   consider: \'nifti_tool -help\'\n");
        return 1;
      }
      iVar1 = add_string(&opts->elist,argv[index_1]);
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = add_int(&opts->etypes,4);
      if (iVar1 != 0) {
        return -1;
      }
      opts->add_exts = 1;
    }
    else {
      iVar1 = strncmp(argv[index_1],"-add_comment_ext",9);
      if (iVar1 == 0) {
        index_1 = index_1 + 1;
        if (argc <= index_1) {
          fprintf(_stderr,"** option \'%s\': missing parameter\n","-add_comment_ext");
          fprintf(_stderr,"   consider: \'nifti_tool -help\'\n");
          return 1;
        }
        iVar1 = add_string(&opts->elist,argv[index_1]);
        if (iVar1 != 0) {
          return -1;
        }
        iVar1 = add_int(&opts->etypes,6);
        if (iVar1 != 0) {
          return -1;
        }
        opts->add_exts = 1;
      }
      else {
        iVar1 = strncmp(argv[index_1],"-check_hdr",10);
        if (iVar1 == 0) {
          opts->check_hdr = 1;
        }
        else {
          iVar1 = strncmp(argv[index_1],"-check_nim",10);
          if (iVar1 == 0) {
            opts->check_nim = 1;
          }
          else {
            iVar1 = strncmp(argv[index_1],"-copy_brick_list",0xb);
            if (((iVar1 == 0) || (iVar1 = strncmp(argv[index_1],"-copy_im",10), iVar1 == 0)) ||
               (iVar1 = strncmp(argv[index_1],"-cbl",4), iVar1 == 0)) {
              opts->cbl = 1;
            }
            else {
              iVar1 = strncmp(argv[index_1],"-copy_collapsed_image",10);
              if ((iVar1 == 0) || (iVar1 = strncmp(argv[index_1],"-cci",4), iVar1 == 0)) {
                opts->ci_dims[0] = 0;
                for (index_2 = 1; index_2 < 8; index_2 = index_2 + 1) {
                  index_1 = index_1 + 1;
                  if (argc <= index_1) {
                    fprintf(_stderr,"** option \'%s\': %s\n","-cci","7 dimension values are requred"
                           );
                    fprintf(_stderr,"   consider: \'nifti_tool -help\'\n");
                    return 1;
                  }
                  ppuVar2 = __ctype_b_loc();
                  if ((((*ppuVar2)[(int)*argv[index_1]] & 0x800) == 0) &&
                     (iVar1 = strcmp(argv[index_1],"-1"), iVar1 != 0)) {
                    fprintf(_stderr,
                            "** -cci param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                            ,(ulong)(uint)index_2,argv[index_1]);
                    return -1;
                  }
                  iVar1 = atoi(argv[index_1]);
                  opts->ci_dims[index_2] = iVar1;
                }
                opts->cci = 1;
              }
              else {
                iVar1 = strncmp(argv[index_1],"-debug",6);
                if (iVar1 == 0) {
                  index_1 = index_1 + 1;
                  if (argc <= index_1) {
                    fprintf(_stderr,"** option \'%s\': missing parameter\n","-debug");
                    fprintf(_stderr,"   consider: \'nifti_tool -help\'\n");
                    return 1;
                  }
                  iVar1 = atoi(argv[index_1]);
                  opts->debug = iVar1;
                }
                else {
                  iVar1 = strncmp(argv[index_1],"-diff_hdr",8);
                  if (iVar1 == 0) {
                    opts->diff_hdr = 1;
                  }
                  else {
                    iVar1 = strncmp(argv[index_1],"-diff_nim",8);
                    if (iVar1 == 0) {
                      opts->diff_nim = 1;
                    }
                    else {
                      iVar1 = strncmp(argv[index_1],"-disp_exts",7);
                      if (iVar1 == 0) {
                        opts->disp_exts = 1;
                      }
                      else {
                        iVar1 = strncmp(argv[index_1],"-disp_hdr",8);
                        if (iVar1 == 0) {
                          opts->disp_hdr = 1;
                        }
                        else {
                          iVar1 = strncmp(argv[index_1],"-disp_nim",8);
                          if (iVar1 == 0) {
                            opts->disp_nim = 1;
                          }
                          else {
                            iVar1 = strncmp(argv[index_1],"-disp_ana",8);
                            if (iVar1 == 0) {
                              opts->disp_ana = 1;
                            }
                            else {
                              iVar1 = strncmp(argv[index_1],"-dci_lines",6);
                              if ((iVar1 == 0) ||
                                 (iVar1 = strncmp(argv[index_1],"-dts_lines",6), iVar1 == 0)) {
                                opts->dci_lines = 1;
                              }
                              else {
                                iVar1 = strncmp(argv[index_1],"-disp_collapsed_image",10);
                                if ((iVar1 == 0) ||
                                   (iVar1 = strncmp(argv[index_1],"-disp_ci",8), iVar1 == 0)) {
                                  opts->ci_dims[0] = 0;
                                  for (count = 1; count < 8; count = count + 1) {
                                    index_1 = index_1 + 1;
                                    if (argc <= index_1) {
                                      fprintf(_stderr,"** option \'%s\': %s\n","-disp_ci",
                                              "7 dimension values are requred");
                                      fprintf(_stderr,"   consider: \'nifti_tool -help\'\n");
                                      return 1;
                                    }
                                    ppuVar2 = __ctype_b_loc();
                                    if ((((*ppuVar2)[(int)*argv[index_1]] & 0x800) == 0) &&
                                       (iVar1 = strcmp(argv[index_1],"-1"), iVar1 != 0)) {
                                      fprintf(_stderr,
                                              "** -disp_ci param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                                              ,(ulong)(uint)count,argv[index_1]);
                                      return -1;
                                    }
                                    iVar1 = atoi(argv[index_1]);
                                    opts->ci_dims[count] = iVar1;
                                  }
                                  opts->dci = 1;
                                }
                                else {
                                  iVar1 = strncmp(argv[index_1],"-disp_ts",10);
                                  if ((iVar1 == 0) ||
                                     (iVar1 = strncmp(argv[index_1],"-dts",4), iVar1 == 0)) {
                                    for (index_3 = 1; index_3 < 4; index_3 = index_3 + 1) {
                                      index_1 = index_1 + 1;
                                      if (argc <= index_1) {
                                        fprintf(_stderr,"** option \'%s\': %s\n","-dts",
                                                "i,j,k indices are requied\n");
                                        fprintf(_stderr,"   consider: \'nifti_tool -help\'\n");
                                        return 1;
                                      }
                                      ppuVar2 = __ctype_b_loc();
                                      if (((*ppuVar2)[(int)*argv[index_1]] & 0x800) == 0) {
                                        fprintf(_stderr,
                                                "** -dts param %d (= \'%s\') is not a number\n   consider: \'nifti_tool -help\'\n"
                                                ,(ulong)(uint)index_3,argv[index_1]);
                                        return -1;
                                      }
                                      iVar1 = atoi(argv[index_1]);
                                      opts->ci_dims[index_3] = iVar1;
                                    }
                                    opts->ci_dims[0] = 0;
                                    for (index_3 = 4; index_3 < 8; index_3 = index_3 + 1) {
                                      opts->ci_dims[index_3] = -1;
                                    }
                                    opts->dts = 1;
                                  }
                                  else {
                                    iVar1 = strncmp(argv[index_1],"-field",2);
                                    if (iVar1 == 0) {
                                      index_1 = index_1 + 1;
                                      if (argc <= index_1) {
                                        fprintf(_stderr,"** option \'%s\': missing parameter\n",
                                                "-field");
                                        fprintf(_stderr,"   consider: \'nifti_tool -help\'\n");
                                        return 1;
                                      }
                                      iVar1 = add_string(&opts->flist,argv[index_1]);
                                      if (iVar1 != 0) {
                                        return -1;
                                      }
                                    }
                                    else {
                                      iVar1 = strncmp(argv[index_1],"-infiles",3);
                                      if (iVar1 == 0) {
                                        index_4 = 0;
                                        iVar1 = index_1;
                                        while( true ) {
                                          index_1 = iVar1 + 1;
                                          bVar4 = false;
                                          if (index_1 < argc) {
                                            bVar4 = *argv[index_1] != '-';
                                          }
                                          if (!bVar4) break;
                                          iVar1 = add_string(&opts->infiles,argv[index_1]);
                                          if (iVar1 != 0) {
                                            return -1;
                                          }
                                          index_4 = index_4 + 1;
                                          iVar1 = index_1;
                                        }
                                        if ((0 < index_4) && (index_1 < argc)) {
                                          index_1 = iVar1;
                                        }
                                        if (2 < g_debug) {
                                          fprintf(_stderr,"+d have %d file names\n",
                                                  (ulong)(uint)index_4);
                                        }
                                      }
                                      else {
                                        iVar1 = strncmp(argv[index_1],"-make_image",8);
                                        if (iVar1 == 0) {
                                          opts->make_im = 1;
                                        }
                                        else {
                                          iVar1 = strncmp(argv[index_1],"-mod_field",6);
                                          if (iVar1 == 0) {
                                            if (argc <= index_1 + 1) {
                                              fprintf(_stderr,
                                                  "** option \'%s\': missing parameter\n",
                                                  "-mod_field");
                                              fprintf(_stderr,"   consider: \'nifti_tool -help\'\n")
                                              ;
                                              return 1;
                                            }
                                            iVar1 = add_string(&opts->flist,argv[index_1 + 1]);
                                            if (iVar1 != 0) {
                                              return -1;
                                            }
                                            index_1 = index_1 + 2;
                                            if (argc <= index_1) {
                                              fprintf(_stderr,
                                                  "** option \'%s\': missing parameter\n",
                                                  "-mod_field (2)");
                                              fprintf(_stderr,"   consider: \'nifti_tool -help\'\n")
                                              ;
                                              return 1;
                                            }
                                            iVar1 = add_string(&opts->vlist,argv[index_1]);
                                            if (iVar1 != 0) {
                                              return -1;
                                            }
                                          }
                                          else {
                                            iVar1 = strncmp(argv[index_1],"-mod_hdr",7);
                                            if (iVar1 == 0) {
                                              opts->mod_hdr = 1;
                                            }
                                            else {
                                              iVar1 = strncmp(argv[index_1],"-mod_nim",7);
                                              if (iVar1 == 0) {
                                                opts->mod_nim = 1;
                                              }
                                              else {
                                                iVar1 = strncmp(argv[index_1],"-keep_hist",5);
                                                if (iVar1 == 0) {
                                                  opts->keep_hist = 1;
                                                }
                                                else {
                                                  iVar1 = strncmp(argv[index_1],"-new_dim",8);
                                                  if (iVar1 == 0) {
                                                    for (local_38 = 0; (int)local_38 < 8;
                                                        local_38 = local_38 + 1) {
                                                      index_1 = index_1 + 1;
                                                      if (argc <= index_1) {
                                                        fprintf(_stderr,"** option \'%s\': %s\n",
                                                                "-new_dim",
                                                                "8 dim values are requred");
                                                        fprintf(_stderr,
                                                  "   consider: \'nifti_tool -help\'\n");
                                                  return 1;
                                                  }
                                                  ppuVar2 = __ctype_b_loc();
                                                  if ((((*ppuVar2)[(int)*argv[index_1]] & 0x800) ==
                                                       0) && (iVar1 = strcmp(argv[index_1],"-1"),
                                                             iVar1 != 0)) {
                                                    fprintf(_stderr,
                                                  "** -new_dim param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                                                  ,(ulong)local_38,argv[index_1]);
                                                  return -1;
                                                  }
                                                  iVar1 = atoi(argv[index_1]);
                                                  opts->new_dim[(int)local_38] = iVar1;
                                                  }
                                                  }
                                                  else {
                                                    iVar1 = strncmp(argv[index_1],"-new_datatype",10
                                                                   );
                                                    if (iVar1 == 0) {
                                                      index_1 = index_1 + 1;
                                                      if (argc <= index_1) {
                                                        fprintf(_stderr,
                                                  "** option \'%s\': missing parameter\n",
                                                  "-new_datatype");
                                                  fprintf(_stderr,
                                                  "   consider: \'nifti_tool -help\'\n");
                                                  return 1;
                                                  }
                                                  iVar1 = atoi(argv[index_1]);
                                                  opts->new_datatype = iVar1;
                                                  }
                                                  else {
                                                    iVar1 = strncmp(argv[index_1],"-overwrite",6);
                                                    if (iVar1 == 0) {
                                                      opts->overwrite = 1;
                                                    }
                                                    else {
                                                      iVar1 = strncmp(argv[index_1],"-prefix",4);
                                                      if (iVar1 == 0) {
                                                        index_1 = index_1 + 1;
                                                        if (argc <= index_1) {
                                                          fprintf(_stderr,
                                                  "** option \'%s\': missing parameter\n","-prefix")
                                                  ;
                                                  fprintf(_stderr,
                                                  "   consider: \'nifti_tool -help\'\n");
                                                  return 1;
                                                  }
                                                  opts->prefix = argv[index_1];
                                                  }
                                                  else {
                                                    iVar1 = strncmp(argv[index_1],"-quiet",3);
                                                    if (iVar1 == 0) {
                                                      opts->debug = 0;
                                                    }
                                                    else {
                                                      iVar1 = strncmp(argv[index_1],"-rm_ext",7);
                                                      if (iVar1 == 0) {
                                                        index_1 = index_1 + 1;
                                                        if (argc <= index_1) {
                                                          fprintf(_stderr,
                                                  "** option \'%s\': missing parameter\n","-rm_ext")
                                                  ;
                                                  fprintf(_stderr,
                                                  "   consider: \'nifti_tool -help\'\n");
                                                  return 1;
                                                  }
                                                  iVar1 = strcmp(argv[index_1],"ALL");
                                                  if (iVar1 == 0) {
                                                    iVar1 = add_string(&opts->elist,"-1");
                                                    if (iVar1 != 0) {
                                                      return -1;
                                                    }
                                                  }
                                                  else {
                                                    iVar1 = atoi(argv[index_1]);
                                                    if ((iVar1 != -1) &&
                                                       ((1000 < iVar1 ||
                                                        (ppuVar2 = __ctype_b_loc(),
                                                        ((*ppuVar2)[(int)*argv[index_1]] & 0x800) ==
                                                        0)))) {
                                                      fprintf(_stderr,
                                                  "** \'-rm_ext\' requires an extension index (read \'%s\')\n"
                                                  ,argv[index_1]);
                                                  return -1;
                                                  }
                                                  iVar1 = add_string(&opts->elist,argv[index_1]);
                                                  if (iVar1 != 0) {
                                                    return -1;
                                                  }
                                                  }
                                                  opts->rm_exts = 1;
                                                  }
                                                  else {
                                                    iVar1 = strncmp(argv[index_1],"-strip_extras",6)
                                                    ;
                                                    if (iVar1 == 0) {
                                                      opts->strip = 1;
                                                    }
                                                    else {
                                                      iVar1 = strncmp(argv[index_1],
                                                                      "-swap_as_analyze",0xc);
                                                      if (iVar1 == 0) {
                                                        opts->swap_ana = 1;
                                                      }
                                                      else {
                                                        iVar1 = strncmp(argv[index_1],
                                                                        "-swap_as_nifti",0xc);
                                                        if (iVar1 == 0) {
                                                          opts->swap_hdr = 1;
                                                        }
                                                        else {
                                                          iVar1 = strncmp(argv[index_1],
                                                                          "-swap_as_old",0xc);
                                                          if (iVar1 != 0) {
                                                            fprintf(_stderr,
                                                  "** unknown option: \'%s\'\n",argv[index_1]);
                                                  return -1;
                                                  }
                                                  opts->swap_old = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    index_1 = index_1 + 1;
  }
  iVar1 = usage(*argv,6);
  return iVar1;
}

Assistant:

int process_opts( int argc, char * argv[], nt_opts * opts )
{
   int ac;

   memset(opts, 0, sizeof(*opts));

   opts->prefix = NULL;
   opts->debug = 1;  /* init debug level to basic output */

   /* init options for creating a new dataset via "MAKE_IM" */
   opts->new_datatype = NIFTI_TYPE_INT16;
   opts->new_dim[0] = 3;
   opts->new_dim[1] = 1;  opts->new_dim[2] = 1;  opts->new_dim[3] = 1;

   if( argc < 2 ) return usage(argv[0], USE_FULL);

   /* terminal options are first, the rest are sorted */
   for( ac = 1; ac < argc; ac++ )
   {
      if( ! strncmp(argv[ac], "-help_datatypes", 9) )
      {
         ac++;
         if( ac >= argc )
            nifti_disp_type_list(3);  /* show all types */
         else if( argv[ac][0] == 'd' || argv[ac][0] == 'D' )
            nifti_disp_type_list(1);  /* show DT_* types */
         else if( argv[ac][0] == 't' || argv[ac][0] == 'T' )
            nifti_test_datatype_sizes(1); /* test each nbyper and swapsize */
         else
            nifti_disp_type_list(2);  /* show NIFTI_* types */
         return 1;
      }
      else if( ! strncmp(argv[ac], "-help_hdr", 9) )
         return usage(argv[0], USE_FIELD_HDR);
      else if( ! strncmp(argv[ac], "-help_nim", 9) )
         return usage(argv[0], USE_FIELD_NIM);
      else if( ! strncmp(argv[ac], "-help_ana", 9) )
         return usage(argv[0], USE_FIELD_ANA);
      else if( ! strncmp(argv[ac], "-help", 5) )
         return usage(argv[0], USE_FULL);
      else if( ! strncmp(argv[ac], "-hist", 5) )
         return usage(argv[0], USE_HIST);
      else if( ! strncmp(argv[ac], "-ver", 2) )
         return usage(argv[0], USE_VERSION);
      else if( ! strncmp(argv[ac], "-nifti_hist", 11) )
      {
         nifti_disp_lib_hist();
         return 1;
      }
      else if( ! strncmp(argv[ac], "-nifti_ver", 10) )
      {
         nifti_disp_lib_version();
         return 1;
      }
      else if( ! strncmp(argv[ac], "-with_zlib", 5) ) {
         printf("Was NIfTI library compiled with zlib?  %s\n",
                nifti_compiled_with_zlib() ? "YES" : "NO");
         return 1;
      }

      /* begin normal execution options... */
      else if( ! strncmp(argv[ac], "-add_afni_ext", 9) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-add_afni_ext");
         if( add_string(&opts->elist, argv[ac]) ) return -1; /* add extension */
         if( add_int(&opts->etypes, NIFTI_ECODE_AFNI) ) return -1;
         opts->add_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-add_comment_ext", 9) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-add_comment_ext");
         if( add_string(&opts->elist, argv[ac]) ) return -1; /* add extension */
         if( add_int(&opts->etypes, NIFTI_ECODE_COMMENT) ) return -1;
         opts->add_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-check_hdr", 10) )
         opts->check_hdr = 1;
      else if( ! strncmp(argv[ac], "-check_nim", 10) )
         opts->check_nim = 1;
      else if( ! strncmp(argv[ac], "-copy_brick_list", 11) ||
               ! strncmp(argv[ac], "-copy_im", 10) ||
               ! strncmp(argv[ac], "-cbl", 4) )
      {
         opts->cbl = 1;
      }
      else if( ! strncmp(argv[ac], "-copy_collapsed_image", 10) ||
               ! strncmp(argv[ac], "-cci", 4) )
      {
         /* we need to read in the 7 dimension values */
         int index;
         opts->ci_dims[0] = 0;
         for( index = 1; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-cci","7 dimension values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -cci param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }

         opts->cci = 1;
      }
      else if( ! strncmp(argv[ac], "-debug", 6) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-debug");
         opts->debug = atoi(argv[ac]);
      }
      else if( ! strncmp(argv[ac], "-diff_hdr", 8) )
         opts->diff_hdr = 1;
      else if( ! strncmp(argv[ac], "-diff_nim", 8) )
         opts->diff_nim = 1;
      else if( ! strncmp(argv[ac], "-disp_exts", 7) )
         opts->disp_exts = 1;
      else if( ! strncmp(argv[ac], "-disp_hdr", 8) )
         opts->disp_hdr = 1;
      else if( ! strncmp(argv[ac], "-disp_nim", 8) )
         opts->disp_nim = 1;
      else if( ! strncmp(argv[ac], "-disp_ana", 8) )
         opts->disp_ana = 1;
      else if( ! strncmp(argv[ac], "-dci_lines", 6) ||   /* before -dts */
               ! strncmp(argv[ac], "-dts_lines", 6) )
      {
         opts->dci_lines = 1;
      }
      else if( ! strncmp(argv[ac], "-disp_collapsed_image", 10) ||
               ! strncmp(argv[ac], "-disp_ci", 8) )
      {
         /* we need to read in the 7 dimension values */
         int index;
         opts->ci_dims[0] = 0;
         for( index = 1; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-disp_ci",
                               "7 dimension values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -disp_ci param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }

         opts->dci = 1;
      }
      else if( ! strncmp(argv[ac], "-disp_ts", 10) ||
               ! strncmp(argv[ac], "-dts", 4) )
      {
         /* we need to read in the ijk indices into the ci_dims array */
         int index;
         for( index = 1; index <= 3; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-dts","i,j,k indices are requied\n");
            if( ! isdigit(argv[ac][0]) ){
               fprintf(stderr,"** -dts param %d (= '%s') is not a number\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }
         /* and fill the rest of the array */
         opts->ci_dims[0] = 0;
         for( index = 4; index < 8; index++ ) opts->ci_dims[index] = -1;

         opts->dts = 1;
      }
      else if( ! strncmp(argv[ac], "-field", 2) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-field");
         if( add_string(&opts->flist, argv[ac]) ) return -1; /* add field */
      }
      else if( ! strncmp(argv[ac], "-infiles", 3) )
      {
         int count;
         /* for -infiles, get all next arguments until a '-' or done */
         ac++;
         for( count = 0; (ac < argc) && (argv[ac][0] != '-'); ac++, count++ )
            if( add_string(&opts->infiles, argv[ac]) ) return -1;/* add field */
         if( count > 0 && ac < argc ) ac--;  /* more options to process */
         if( g_debug > 2 ) fprintf(stderr,"+d have %d file names\n", count);
      }
      else if( ! strncmp(argv[ac], "-make_image", 8) )
      {
         opts->make_im = 1;  /* will setup later, as -cbl and MAKE_IM */
      }
      else if( ! strncmp(argv[ac], "-mod_field", 6) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-mod_field");
         if( add_string(&opts->flist, argv[ac]) ) return -1; /* add field */
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-mod_field (2)");
         if( add_string(&opts->vlist, argv[ac]) ) return -1; /* add value */
      }
      else if( ! strncmp(argv[ac], "-mod_hdr", 7) )
         opts->mod_hdr = 1;
      else if( ! strncmp(argv[ac], "-mod_nim", 7) )
         opts->mod_nim = 1;
      else if( ! strncmp(argv[ac], "-keep_hist", 5) )
         opts->keep_hist = 1;
      else if( ! strncmp(argv[ac], "-new_dim", 8) )
      {
         /* we need to read in the 8 dimension values */
         int index;
         for( index = 0; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-new_dim","8 dim values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -new_dim param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->new_dim[index] = atoi(argv[ac]);
         }
      }
      else if( ! strncmp(argv[ac], "-new_datatype", 10) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-new_datatype");
         opts->new_datatype = atoi(argv[ac]);
      }
      else if( ! strncmp(argv[ac], "-overwrite", 6) )
         opts->overwrite = 1;
      else if( ! strncmp(argv[ac], "-prefix", 4) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-prefix");
         opts->prefix = argv[ac];
      }
      else if( ! strncmp(argv[ac], "-quiet", 3) )
         opts->debug = 0;
      else if( ! strncmp(argv[ac], "-rm_ext", 7) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-rm_ext");
         if( strcmp(argv[ac],"ALL") == 0 )  /* special case, pass -1 */
         {
            if( add_string(&opts->elist, "-1") ) return -1;
         }
         else
         {
            int index = atoi(argv[ac]);
            if( (index != -1) && ((index > 1000) || !isdigit(*argv[ac])) ){
               fprintf(stderr,
                    "** '-rm_ext' requires an extension index (read '%s')\n",
                    argv[ac]);
               return -1;
            }
            if( add_string(&opts->elist, argv[ac]) ) return -1;
         }
         opts->rm_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-strip_extras", 6) )
         opts->strip = 1;
      else if( ! strncmp(argv[ac], "-swap_as_analyze", 12) )
         opts->swap_ana = 1;
      else if( ! strncmp(argv[ac], "-swap_as_nifti", 12) )
         opts->swap_hdr = 1;
      else if( ! strncmp(argv[ac], "-swap_as_old", 12) )
         opts->swap_old = 1;
      else
      {
         fprintf(stderr,"** unknown option: '%s'\n", argv[ac]);
         return -1;
      }
   }

   if( opts->make_im )
   {
      if( opts->infiles.len > 0 )
      {
         fprintf(stderr,"** -infiles is invalid when using -make_im\n");
         return -1;
      }
      /* apply -make_im via -cbl and "MAKE_IM" */
      opts->cbl = 1;
      if( add_string(&opts->infiles, NT_MAKE_IM_NAME) ) return -1;
   }

   /* verify for programming purposes */
   if( opts->add_exts && ( opts->elist.len != opts->etypes.len ) )
   {
      fprintf(stderr,"** ext list length (%d) != etype length (%d)\n",
              opts->elist.len, opts->etypes.len);
      return -1;
   }

   g_debug = opts->debug;
   nifti_set_debug_level(g_debug);

   fill_cmd_string(opts, argc, argv);  /* copy this command */

   if( g_debug > 2 ) disp_nt_opts("options read: ", opts);

   return 0;
}